

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vary_output_len.c
# Opt level: O2

int run_test(test_ctx context,test_vector vec,char *test_name)

{
  int iVar1;
  uint uVar2;
  uint8_t *observed;
  uint8_t *buf;
  ulong uVar3;
  FILE *__stream;
  char *pcVar4;
  undefined8 uStack_50;
  
  observed = (uint8_t *)malloc(0x83);
  buf = (uint8_t *)calloc(vec.input_len,1);
  generate_input(buf,(int)vec.input_len);
  uVar3 = 0;
  do {
    if (uVar3 == 0x84) {
      iVar1 = 0;
      printf("%s passed!\n",test_name);
LAB_00101382:
      free(observed);
      free(buf);
      return iVar1;
    }
    memset(observed,0,0x83);
    iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)context.ctx,(EVP_MD *)context.md,(ENGINE *)0x0);
    if (iVar1 != 1) {
      ERR_print_errors_fp(_stderr);
      __stream = _stderr;
      uVar2 = EVP_DigestInit_ex((EVP_MD_CTX *)context.ctx,(EVP_MD *)context.md,(ENGINE *)0x0);
      pcVar4 = "EVP_DigestInit_ex(context.ctx, context.md, NULL)";
      uStack_50 = 0x4a;
LAB_00101457:
      fprintf(__stream,"Failed %s:%i %s %i\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/J-Montgomery[P]blake3-prov/test/vary_output_len.c"
              ,uStack_50,pcVar4,(ulong)uVar2);
      return 1;
    }
    iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)context.ctx,buf,vec.input_len);
    if (iVar1 != 1) {
      ERR_print_errors_fp(_stderr);
      __stream = _stderr;
      uVar2 = EVP_DigestUpdate((EVP_MD_CTX *)context.ctx,buf,vec.input_len);
      pcVar4 = "EVP_DigestUpdate(context.ctx, in_buf, vec.input_len)";
      uStack_50 = 0x4b;
      goto LAB_00101457;
    }
    iVar1 = EVP_DigestFinalXOF(context.ctx,observed,uVar3);
    if (iVar1 != 1) {
      ERR_print_errors_fp(_stderr);
      __stream = _stderr;
      uVar2 = EVP_DigestFinalXOF(context.ctx,observed,uVar3);
      pcVar4 = "EVP_DigestFinalXOF(context.ctx, out_buf, out_len)";
      uStack_50 = 0x4c;
      goto LAB_00101457;
    }
    iVar1 = compare_buffers(observed,vec.hash,(int)uVar3);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s-%i Failed\n",test_name,uVar3 & 0xffffffff);
      iVar1 = 1;
      goto LAB_00101382;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int run_test(struct test_ctx context, struct test_vector vec, char *test_name)
{
	uint8_t *out_buf;
	uint8_t *in_buf;
	int ret = 0;

	out_buf = (uint8_t *)malloc(TEST_HASH_LEN);
	in_buf = (uint8_t *)calloc(vec.input_len, 1);
	generate_input(in_buf, vec.input_len);

	for (int out_len = 0; out_len <= TEST_HASH_LEN; out_len++) {
		memset(out_buf, 0, TEST_HASH_LEN);

		TEST_TRUE(EVP_DigestInit_ex(context.ctx, context.md, NULL));
		TEST_TRUE(EVP_DigestUpdate(context.ctx, in_buf, vec.input_len));
		TEST_TRUE(EVP_DigestFinalXOF(context.ctx, out_buf, out_len));

		ret = compare_buffers(out_buf, vec.hash, out_len);
		if(ret) {
			fprintf(stderr, "%s-%i Failed\n", test_name, out_len);
			break;
		}
	}


	if (!ret)
		printf("%s passed!\n", test_name);

	free(out_buf);
	free(in_buf);

	return ret;
}